

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg.c
# Opt level: O0

libcaption_stauts_t sei_from_caption_frame(sei_t *sei,caption_frame_t *frame)

{
  uint16_t uVar1;
  uint16_t uVar2;
  int iVar3;
  utf8_char_t *puVar4;
  int iVar5;
  double *in_RSI;
  caption_frame_t *in_RDI;
  bool bVar6;
  uint16_t cc_data;
  int tab;
  eia608_style_t prev_styl;
  eia608_style_t styl;
  uint16_t prev_cc_data;
  char *data;
  cea708_t cea708;
  int prev_unl;
  int unl;
  int c;
  int r;
  int in_stack_fffffffffffffec8;
  eia608_style_t in_stack_fffffffffffffecc;
  caption_frame_t *in_stack_fffffffffffffed0;
  caption_frame_t *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  caption_frame_t *in_stack_fffffffffffffee8;
  caption_frame_t *in_stack_fffffffffffffef0;
  caption_frame_t *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  int local_d4;
  int local_d0;
  uint16_t local_ca;
  char *local_c8;
  cea708_t local_c0;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  double *local_10;
  caption_frame_t *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  sei_init((sei_t *)in_RDI,*in_RSI);
  cea708_init((cea708_t *)in_stack_fffffffffffffed0,
              (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  uVar2 = eia608_control_command
                    ((eia608_control_t)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  cea708_add_cc_data(&local_c0,1,cc_type_ntsc_cc_field_1,uVar2);
  uVar2 = eia608_control_command
                    ((eia608_control_t)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  cea708_add_cc_data(&local_c0,1,cc_type_ntsc_cc_field_1,uVar2);
  for (local_14 = 0; local_14 < 0xf; local_14 = local_14 + 1) {
    local_20 = 0;
    local_d4 = 0;
    local_18 = 0;
    while( true ) {
      bVar6 = false;
      if (local_18 < 0x20) {
        puVar4 = caption_frame_read_char
                           (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                            in_stack_fffffffffffffee0,(eia608_style_t *)in_stack_fffffffffffffed8,
                            (int *)in_stack_fffffffffffffed0);
        bVar6 = *puVar4 == '\0';
      }
      if (!bVar6) break;
      local_18 = local_18 + 1;
    }
    if (local_18 != 0x20) {
      iVar3 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
      if ((local_18 < 1) && ((local_1c != 0 || (local_d0 != 0)))) {
        eia608_row_style_pramble
                  (iVar3,(int)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                   in_stack_fffffffffffffec8);
        sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                          (cea708_t *)in_stack_fffffffffffffef8,
                          (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
        local_20 = local_1c;
        local_d4 = local_d0;
      }
      else {
        iVar5 = local_18 % 4;
        eia608_row_column_pramble
                  (iVar3,(int)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                   in_stack_fffffffffffffec8);
        sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                          (cea708_t *)in_stack_fffffffffffffef8,
                          (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
        if (iVar5 != 0) {
          eia608_tab(0,0x10a26f);
          sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                            (cea708_t *)in_stack_fffffffffffffef8,
                            (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
        }
      }
      local_ca = 0;
      local_c8 = caption_frame_read_char
                           (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                            in_stack_fffffffffffffee0,(eia608_style_t *)in_stack_fffffffffffffed8,
                            (int *)in_stack_fffffffffffffed0);
      while (in_stack_ffffffffffffff07 = *local_c8 != '\0' && local_18 < 0x20,
            *local_c8 != '\0' && local_18 < 0x20) {
        uVar2 = eia608_from_utf8_1((utf8_char_t *)
                                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
        if ((local_1c != local_20) || (local_d0 != local_d4)) {
          in_stack_fffffffffffffef8 = local_8;
          eia608_midrow_change
                    ((int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                     (eia608_style_t)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
          sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                            (cea708_t *)in_stack_fffffffffffffef8,
                            (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
          local_20 = local_1c;
          local_d4 = local_d0;
        }
        uVar1 = local_ca;
        if (uVar2 != 0) {
          iVar3 = eia608_is_basicna(local_ca);
          if (iVar3 == 0) {
            iVar3 = eia608_is_westeu(uVar2);
            if (iVar3 == 0) {
              iVar3 = eia608_is_basicna(uVar2);
              uVar1 = uVar2;
              if (iVar3 == 0) {
                sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,
                                                    in_stack_ffffffffffffff00),
                                  (cea708_t *)in_stack_fffffffffffffef8,
                                  (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
                uVar1 = local_ca;
              }
            }
            else {
              in_stack_fffffffffffffed8 = local_8;
              eia608_from_utf8_1((utf8_char_t *)
                                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
              sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,
                                                  in_stack_ffffffffffffff00),
                                (cea708_t *)in_stack_fffffffffffffef8,
                                (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
              sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,
                                                  in_stack_ffffffffffffff00),
                                (cea708_t *)in_stack_fffffffffffffef8,
                                (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
            }
          }
          else {
            iVar3 = eia608_is_basicna(uVar2);
            if (iVar3 == 0) {
              iVar3 = eia608_is_westeu(uVar2);
              if (iVar3 == 0) {
                sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,
                                                    in_stack_ffffffffffffff00),
                                  (cea708_t *)in_stack_fffffffffffffef8,
                                  (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
                sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,
                                                    in_stack_ffffffffffffff00),
                                  (cea708_t *)in_stack_fffffffffffffef8,
                                  (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
              }
              else {
                in_stack_fffffffffffffee4 = CONCAT22(local_ca,(short)in_stack_fffffffffffffee4);
                in_stack_fffffffffffffee8 = local_8;
                eia608_from_utf8_1((utf8_char_t *)
                                   CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),0);
                eia608_from_basicna(0,0x10);
                sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,
                                                    in_stack_ffffffffffffff00),
                                  (cea708_t *)in_stack_fffffffffffffef8,
                                  (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
                sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,
                                                    in_stack_ffffffffffffff00),
                                  (cea708_t *)in_stack_fffffffffffffef8,
                                  (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
              }
            }
            else {
              in_stack_fffffffffffffef0 = local_8;
              eia608_from_basicna(0,0x10);
              sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,
                                                  in_stack_ffffffffffffff00),
                                (cea708_t *)in_stack_fffffffffffffef8,
                                (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
            }
            local_ca = 0;
            uVar1 = local_ca;
          }
        }
        local_ca = uVar1;
        iVar3 = eia608_is_specialna(uVar2);
        if (iVar3 != 0) {
          in_stack_fffffffffffffed0 = local_8;
          eia608_control_command((eia608_control_t)local_8,in_stack_fffffffffffffecc);
          sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                            (cea708_t *)in_stack_fffffffffffffef8,
                            (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
        }
        local_18 = local_18 + 1;
        local_c8 = caption_frame_read_char
                             (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                              in_stack_fffffffffffffee0,(eia608_style_t *)in_stack_fffffffffffffed8,
                              (int *)in_stack_fffffffffffffed0);
      }
      if (local_ca != 0) {
        sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                          (cea708_t *)in_stack_fffffffffffffef8,
                          (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
      }
    }
  }
  sei_encode_eia608((sei_t *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                    (cea708_t *)in_stack_fffffffffffffef8,
                    (uint16_t)((ulong)in_stack_fffffffffffffef0 >> 0x30));
  local_8->timestamp = *local_10;
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t sei_from_caption_frame(sei_t* sei, caption_frame_t* frame)
{
    int r, c;
    int unl, prev_unl;
    cea708_t cea708;
    const char* data;
    uint16_t prev_cc_data;
    eia608_style_t styl, prev_styl;

    sei_init(sei, frame->timestamp);
    cea708_init(&cea708, frame->timestamp); // set up a new popon frame
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_erase_non_displayed_memory, DEFAULT_CHANNEL));
    cea708_add_cc_data(&cea708, 1, cc_type_ntsc_cc_field_1, eia608_control_command(eia608_control_resume_caption_loading, DEFAULT_CHANNEL));

    for (r = 0; r < SCREEN_ROWS; ++r) {
        prev_unl = 0, prev_styl = eia608_style_white;
        // Calculate preamble
        for (c = 0; c < SCREEN_COLS && 0 == *caption_frame_read_char(frame, r, c, &styl, &unl); ++c) {
        }

        // This row is blank
        if (SCREEN_COLS == c) {
            continue;
        }

        // Write preamble
        if (0 < c || (0 == unl && eia608_style_white == styl)) {
            int tab = c % 4;
            sei_encode_eia608(sei, &cea708, eia608_row_column_pramble(r, c, DEFAULT_CHANNEL, 0));
            if (tab) {
                sei_encode_eia608(sei, &cea708, eia608_tab(tab, DEFAULT_CHANNEL));
            }
        } else {
            sei_encode_eia608(sei, &cea708, eia608_row_style_pramble(r, DEFAULT_CHANNEL, styl, unl));
            prev_unl = unl, prev_styl = styl;
        }

        // Write the row
        for (prev_cc_data = 0, data = caption_frame_read_char(frame, r, c, 0, 0);
             (*data) && c < SCREEN_COLS; ++c, data = caption_frame_read_char(frame, r, c, &styl, &unl)) {
            uint16_t cc_data = eia608_from_utf8_1(data, DEFAULT_CHANNEL);

            if (unl != prev_unl || styl != prev_styl) {
                sei_encode_eia608(sei, &cea708, eia608_midrow_change(DEFAULT_CHANNEL, styl, unl));
                prev_unl = unl, prev_styl = styl;
            }

            if (!cc_data) {
                // We do't want to write bad data, so just ignore it.
            } else if (eia608_is_basicna(prev_cc_data)) {
                if (eia608_is_basicna(cc_data)) {
                    // previous and current chars are both basicna, combine them into current
                    sei_encode_eia608(sei, &cea708, eia608_from_basicna(prev_cc_data, cc_data));
                } else if (eia608_is_westeu(cc_data)) {
                    // extended charcters overwrite the previous charcter, so insert a dummy char thren write the extended char
                    sei_encode_eia608(sei, &cea708, eia608_from_basicna(prev_cc_data, eia608_from_utf8_1(EIA608_CHAR_SPACE, DEFAULT_CHANNEL)));
                    sei_encode_eia608(sei, &cea708, cc_data);
                } else {
                    // previous was basic na, but current isnt; write previous and current
                    sei_encode_eia608(sei, &cea708, prev_cc_data);
                    sei_encode_eia608(sei, &cea708, cc_data);
                }

                prev_cc_data = 0; // previous is handled, we can forget it now
            } else if (eia608_is_westeu(cc_data)) {
                // extended chars overwrite the previous chars, so insert a dummy char
                // TODO create a map of alternamt chars for eia608_is_westeu instead of using space
                sei_encode_eia608(sei, &cea708, eia608_from_utf8_1(EIA608_CHAR_SPACE, DEFAULT_CHANNEL));
                sei_encode_eia608(sei, &cea708, cc_data);
            } else if (eia608_is_basicna(cc_data)) {
                prev_cc_data = cc_data;
            } else {
                sei_encode_eia608(sei, &cea708, cc_data);
            }

            if (eia608_is_specialna(cc_data)) {
                // specialna are treated as control charcters. Duplicated control charcters are discarded
                // So we write a resume after a specialna as a noop to break repetition detection
                // TODO only do this if the same charcter is repeated
                sei_encode_eia608(sei, &cea708, eia608_control_command(eia608_control_resume_caption_loading, DEFAULT_CHANNEL));
            }
        }

        if (0 != prev_cc_data) {
            sei_encode_eia608(sei, &cea708, prev_cc_data);
        }
    }

    sei_encode_eia608(sei, &cea708, 0); // flush
    sei->timestamp = frame->timestamp; // assumes in order frames
    // sei_dump (sei);
    return LIBCAPTION_OK;
}